

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

pos sel_spread_half(Terminal *term,pos p,wchar_t dir)

{
  anon_enum_32 aVar1;
  termchar *ptVar2;
  termchar *ptVar3;
  short sVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  termline *line;
  termline *ldata;
  termchar *ptVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  wchar_t y;
  pos local_40;
  
  wVar5 = sblines(term);
  uVar10 = 0;
  line = lineptr(term,p.y,L'᪜',L'\0');
  aVar1 = term->selmode;
  if (aVar1 == DRAGGING) {
    if (dir != L'\xffffffff') {
      uVar10 = (ulong)(uint)(term->cols + L'\xffffffff');
    }
  }
  else {
    uVar10 = (ulong)p >> 0x20;
    uVar8 = (long)p >> 0x20;
    if (aVar1 == ABOUT_TO) {
      if ((p.x != L'\0' && -1 < (long)p) && (line->chars[uVar10].chr == 0xdfff)) {
        uVar8 = (ulong)(uint)(p.x + L'\xffffffff');
      }
      wVar6 = wordtype(term,(wchar_t)line->chars[uVar8].chr);
      sVar4 = (short)wVar6;
      local_40 = p;
      if (dir != L'\x01') {
        uVar8 = uVar10;
        do {
          lVar12 = uVar8 * 0x20 + -0x40;
          uVar14 = (uint)uVar8;
          while( true ) {
            uVar15 = uVar14 - 1;
            uVar10 = (ulong)uVar14;
            p = local_40;
            if ((int)uVar14 < 1) break;
            if (uVar15 == 0) {
              uVar8 = 0;
LAB_00111135:
              lVar9 = uVar8 << 5;
            }
            else {
              uVar8 = (ulong)uVar15;
              lVar9 = lVar12;
              if (line->chars[uVar8].chr != 0xdfff) goto LAB_00111135;
            }
            wVar6 = wordtype(term,*(wchar_t *)((long)&line->chars->chr + lVar9));
            lVar12 = lVar12 + -0x20;
            uVar14 = uVar15;
            if (wVar6 != sVar4) goto LAB_00111213;
          }
          if (local_40.y <= -wVar5) goto LAB_00111213;
          y = local_40.y + L'\xffffffff';
          ldata = lineptr(term,y,L'᫜',L'\0');
          wVar6 = line_cols(term,ldata);
          if ((ldata->lattr & 0x10) == 0) goto LAB_00111213;
          uVar8 = (ulong)(uint)(wVar6 + L'\xffffffff');
          if ((wVar6 < L'\x02') || (ldata->chars[uVar8].chr != 0xdfff)) {
            lVar12 = (long)(wVar6 + L'\xffffffff');
          }
          else {
            lVar12 = (ulong)(uint)wVar6 - 2;
          }
          wVar6 = wordtype(term,(wchar_t)ldata->chars[lVar12].chr);
          if (wVar6 != sVar4) goto LAB_00111206;
          unlineptr(line);
          local_40.x = L'\0';
          local_40.y = y;
          line = ldata;
        } while( true );
      }
      while( true ) {
        wVar5 = line_cols(term,line);
        uVar8 = uVar10;
        while (uVar10 = uVar8, iVar13 = (int)uVar10, p = local_40, iVar13 < wVar5 + L'\xffffffff') {
          uVar14 = iVar13 + 1;
          if ((iVar13 < 0) || (uVar8 = uVar10, line->chars[uVar14].chr != 0xdfff)) {
            uVar8 = (long)(int)uVar14;
          }
          wVar6 = wordtype(term,(wchar_t)line->chars[uVar8].chr);
          uVar8 = (ulong)uVar14;
          if (wVar6 != sVar4) goto LAB_00111213;
        }
        wVar5 = local_40.y + L'\x01';
        if ((term->rows <= wVar5) || ((line->lattr & 0x10) == 0)) goto LAB_00111213;
        ldata = lineptr(term,wVar5,L'᫁',L'\0');
        wVar6 = wordtype(term,(wchar_t)ldata->chars->chr);
        if (wVar6 != sVar4) break;
        unlineptr(line);
        local_40.x = L'\0';
        local_40.y = wVar5;
        uVar10 = 0;
        line = ldata;
      }
LAB_00111206:
      unlineptr(ldata);
      p = local_40;
    }
    else if ((aVar1 == LEXICOGRAPHIC) && ((line->lattr & 0x10) == 0)) {
      ptVar2 = line->chars;
      wVar5 = line_cols(term,line);
      ptVar7 = ptVar2 + wVar5;
      lVar12 = (long)wVar5 * -0x20;
      do {
        lVar9 = lVar12;
        if ((ptVar7 <= ptVar2) ||
           (ptVar7[-1].chr != 0x20 && ((uint)ptVar7[-1].chr & 0xfffffcff) != 0xd820)) break;
        ptVar3 = ptVar7 + -1;
        ptVar7 = ptVar7 + -1;
        lVar12 = lVar9 + 0x20;
      } while (ptVar3->cc_next == L'\0');
      uVar11 = (long)(((ulong)((long)term->cols * 0x20 + lVar9 != 0) * 0x20 - lVar9) + -0x20) >> 5;
      if (((long)uVar11 <= (long)uVar8) && (uVar10 = uVar11, dir != L'\xffffffff')) {
        uVar10 = (ulong)(uint)(term->cols + L'\xffffffff');
      }
    }
  }
LAB_00111213:
  unlineptr(line);
  return (pos)((ulong)p & 0xffffffff | uVar10 << 0x20);
}

Assistant:

static pos sel_spread_half(Terminal *term, pos p, int dir)
{
    termline *ldata;
    short wvalue;
    int topy = -sblines(term);

    ldata = lineptr(p.y);

    switch (term->selmode) {
      case SM_CHAR:
        /*
         * In this mode, every character is a separate unit, except
         * for runs of spaces at the end of a non-wrapping line.
         */
        if (!(ldata->lattr & LATTR_WRAPPED)) {
            termchar *q = ldata->chars + line_cols(term, ldata);
            while (q > ldata->chars &&
                   IS_SPACE_CHR(q[-1].chr) && !q[-1].cc_next)
                q--;
            if (q == ldata->chars + term->cols)
                q--;
            if (p.x >= q - ldata->chars)
                p.x = (dir == -1 ? q - ldata->chars : term->cols - 1);
        }
        break;
      case SM_WORD:
        /*
         * In this mode, the units are maximal runs of characters
         * whose `wordness' has the same value.
         */
        wvalue = wordtype(term, UCSGET(ldata->chars, p.x));
        if (dir == +1) {
            while (1) {
                int maxcols = line_cols(term, ldata);
                if (p.x < maxcols-1) {
                    if (wordtype(term, UCSGET(ldata->chars, p.x+1)) == wvalue)
                        p.x++;
                    else
                        break;
                } else {
                    if (p.y+1 < term->rows &&
                        (ldata->lattr & LATTR_WRAPPED)) {
                        termline *ldata2;
                        ldata2 = lineptr(p.y+1);
                        if (wordtype(term, UCSGET(ldata2->chars, 0))
                            == wvalue) {
                            p.x = 0;
                            p.y++;
                            unlineptr(ldata);
                            ldata = ldata2;
                        } else {
                            unlineptr(ldata2);
                            break;
                        }
                    } else
                        break;
                }
            }
        } else {
            while (1) {
                if (p.x > 0) {
                    if (wordtype(term, UCSGET(ldata->chars, p.x-1)) == wvalue)
                        p.x--;
                    else
                        break;
                } else {
                    termline *ldata2;
                    int maxcols;
                    if (p.y <= topy)
                        break;
                    ldata2 = lineptr(p.y-1);
                    maxcols = line_cols(term, ldata2);
                    if (ldata2->lattr & LATTR_WRAPPED) {
                        if (wordtype(term, UCSGET(ldata2->chars, maxcols-1))
                            == wvalue) {
                            p.x = maxcols-1;
                            p.y--;
                            unlineptr(ldata);
                            ldata = ldata2;
                        } else {
                            unlineptr(ldata2);
                            break;
                        }
                    } else
                        break;
                }
            }
        }
        break;
      case SM_LINE:
        /*
         * In this mode, every line is a unit.
         */
        p.x = (dir == -1 ? 0 : term->cols - 1);
        break;
    }

    unlineptr(ldata);
    return p;
}